

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

int __thiscall CDesign::GetRoutableLayer(CDesign *this,int iMode)

{
  int iMode_local;
  CDesign *this_local;
  
  if (iMode == 0x40) {
    this_local._4_4_ = this->m_iHighestRoutableLayer;
  }
  else {
    if (iMode != 0x80) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x73d,"int CDesign::GetRoutableLayer(int)");
    }
    this_local._4_4_ = this->m_iLowestRoutableLayer;
  }
  return this_local._4_4_;
}

Assistant:

int	CDesign::GetRoutableLayer(int iMode)
{
	switch(iMode){
	case GET_MODE_MAX:	return	m_iHighestRoutableLayer;
	case GET_MODE_MIN:	return	m_iLowestRoutableLayer;
	default:
		assert(FALSE);
		break;
	}

	return	-1;
}